

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *__return_storage_ptr__,string *string,string *separator,bool keep_empty_parts)

{
  long lVar1;
  undefined1 local_88 [8];
  string token;
  undefined1 local_58 [8];
  string token_1;
  size_t s;
  size_t p;
  bool keep_empty_parts_local;
  string *separator_local;
  string *string_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while (token_1.field_2._8_8_ = std::__cxx11::string::find((string *)string,(ulong)separator),
        token_1.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_58,(ulong)string);
    if ((keep_empty_parts) || (lVar1 = std::__cxx11::string::size(), lVar1 != 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)local_58);
    }
    std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)local_58);
  }
  std::__cxx11::string::substr((ulong)local_88,(ulong)string);
  if ((keep_empty_parts) || (lVar1 = std::__cxx11::string::size(), lVar1 != 0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_88);
  }
  std::__cxx11::string::~string((string *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> split(const std::string &string, const std::string &separator, bool keep_empty_parts)
{
	std::vector<std::string> result;
	size_t p = 0;
	
	while (true) {
		size_t s = string.find(separator, p);
		if (s == std::string::npos)
			break;
		std::string token = string.substr(p, s - p);
		if (keep_empty_parts || token.size())
			result.push_back(token);
		p = s + separator.size();
	}

	std::string token = string.substr(p);
	if (keep_empty_parts || token.size())
		result.push_back(token);
	return result;
}